

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

void Imf_3_4::anon_unknown_0::core_error_handler_cb(exr_const_context_t f,int code,char *msg)

{
  char *pcVar1;
  
  pcVar1 = getenv("EXR_CHECK_ENABLE_PRINTS");
  if (pcVar1 != (char *)0x0) {
    _GLOBAL__N_1::core_error_handler_cb();
  }
  return;
}

Assistant:

static void
core_error_handler_cb (exr_const_context_t f, int code, const char* msg)
{
    if (getenv ("EXR_CHECK_ENABLE_PRINTS") != NULL)
    {
        const char* fn;
        if (EXR_ERR_SUCCESS != exr_get_file_name (f, &fn)) fn = "<error>";
        fprintf (
            stderr,
            "ERROR '%s' (%s): %s\n",
            fn,
            exr_get_error_code_as_string (code),
            msg);
    }
}